

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_DataValue *
UA_Server_read(UA_DataValue *__return_storage_ptr__,UA_Server *server,UA_ReadValueId *item,
              UA_TimestampsToReturn timestamps)

{
  UA_DataValue *dv;
  UA_TimestampsToReturn timestamps_local;
  UA_ReadValueId *item_local;
  UA_Server *server_local;
  
  UA_DataValue_init(__return_storage_ptr__);
  Service_Read_single(server,&adminSession,timestamps,item,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

UA_DataValue
UA_Server_read(UA_Server *server, const UA_ReadValueId *item,
               UA_TimestampsToReturn timestamps) {
    UA_DataValue dv;
    UA_DataValue_init(&dv);
    UA_RCU_LOCK();
    Service_Read_single(server, &adminSession, timestamps, item, &dv);
    UA_RCU_UNLOCK();
    return dv;
}